

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::expand_copy_n(void)

{
  size_type __n;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  iterator iVar1;
  allocator_type local_b9;
  vector<int,_std::allocator<int>_> expect;
  undefined8 local_98;
  undefined8 uStack_90;
  iterator local_80;
  iterator local_70;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  __l._M_len = 5;
  __l._M_array = (iterator)&expect;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l,(allocator_type *)&local_98);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&span,4);
  local_98 = 0;
  uStack_90 = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_b9);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_70 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x4a,"void copy_suite::expand_copy_n()",iVar1,local_70,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  __n = span.member.size;
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  std::
  copy_n<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_long,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,__n,iVar1);
  local_98 = 0x160000000b;
  uStack_90 = 0x2c00000021;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_b9);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_80 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x50,"void copy_suite::expand_copy_n()",iVar1,local_80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void expand_copy_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 11, 22, 33, 44, 55 };
    span.expand_back(span.capacity());
    {
        std::vector<int> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    std::copy_n(input.begin(), span.size(), span.begin());
    {
        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}